

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O3

void getPointsBoudingBox(GLfloat (*points) [2],GLsizei n_points,GLfloat (*bounds) [2])

{
  ulong uVar1;
  GLfloat aGVar2 [2];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  GLfloat aGVar5 [2];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (n_points != 0) {
    aGVar2 = *points;
    aGVar5 = aGVar2;
    if (1 < n_points) {
      auVar4._0_8_ = (double)aGVar2[0];
      auVar4._8_8_ = (double)aGVar2[1];
      uVar1 = 1;
      auVar7._8_8_ = auVar4._8_8_;
      auVar7._0_8_ = auVar4._0_8_;
      do {
        auVar6._0_8_ = (double)SUB84(points[uVar1],0);
        auVar6._8_8_ = (double)SUB84(points[uVar1],4);
        auVar3._8_8_ = auVar6._8_8_;
        auVar3._0_8_ = auVar6._0_8_;
        auVar4 = minpd(auVar3,auVar4);
        auVar7 = maxpd(auVar6,auVar7);
        uVar1 = uVar1 + 1;
      } while ((uint)n_points != uVar1);
      aGVar2[0] = (float)auVar4._0_8_;
      aGVar2[1] = (float)auVar4._8_8_;
      aGVar5[0] = (float)auVar7._0_8_;
      aGVar5[1] = (float)auVar7._8_8_;
    }
    *bounds = aGVar2;
    bounds[1] = aGVar5;
  }
  return;
}

Assistant:

void getPointsBoudingBox(GLfloat points[][2], GLsizei n_points, GLfloat bounds[][2]) {
	if (n_points == 0) return;

	double x_min, x_max, y_min, y_max;
	x_min = x_max = points[0][0];
	y_min = y_max = points[0][1];

	for (GLsizei i = 1; i < n_points; i++) {
		x_min = MIN(points[i][0], x_min);
		x_max = MAX(points[i][0], x_max);
		y_min = MIN(points[i][1], y_min);
		y_max = MAX(points[i][1], y_max);
	}

	bounds[0][0] = x_min;
	bounds[0][1] = y_min;
	bounds[1][0] = x_max;
	bounds[1][1] = y_max;
}